

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

Type * type_check_and_push(Type *type,Map *base,size_t struct_size)

{
  Map *pMVar1;
  Map *hold_node;
  size_t struct_size_local;
  Map *base_local;
  Type *type_local;
  
  pMVar1 = Map_Check_And_Get(base,type,struct_size);
  if (pMVar1 == (Map *)0x0) {
    pMVar1 = Map_Push_And_Get(base,type,struct_size,type);
    type->node = pMVar1;
    type_local = type;
  }
  else {
    free(type);
    type_local = (Type *)pMVar1->ID;
  }
  return type_local;
}

Assistant:

struct Type* type_check_and_push(struct Type *type,struct Map *base,size_t struct_size)
{
	struct Map *hold_node;
	hold_node=Map_Check_And_Get(base,type,struct_size);

	if(hold_node==NULL)
	{
		type->node=Map_Push_And_Get(base,type,struct_size,type);
		return type;
	}else
	{
		free(type);
		return (struct Type*)hold_node->ID;
	}
}